

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

string * __thiscall
tinyformat::format<int,int,int,char[12],char[9]>
          (string *__return_storage_ptr__,tinyformat *this,char *fmt,int *args,int *args_1,
          int *args_2,char (*args_3) [12],char (*args_4) [9])

{
  ostringstream local_1b0 [8];
  ostringstream oss;
  char (*args_local_3) [12];
  int *args_local_2;
  int *args_local_1;
  int *args_local;
  char *fmt_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  format<int,int,int,char[12],char[9]>
            ((ostream *)local_1b0,(char *)this,(int *)fmt,args,args_1,(char (*) [12])args_2,
             (char (*) [9])args_3);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}